

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

int cmOutputConverter::Shell__CharNeedsQuotes(char c,int isUnix,int flags)

{
  int iVar1;
  int flags_local;
  int isUnix_local;
  char c_local;
  
  if ((isUnix == 0) && ((flags & 4U) != 0)) {
    isUnix_local = 0;
  }
  else {
    iVar1 = Shell__CharIsWhitespace(c);
    if (iVar1 == 0) {
      if (isUnix == 0) {
        iVar1 = Shell__CharNeedsQuotesOnWindows(c);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        iVar1 = Shell__CharNeedsQuotesOnUnix(c);
        if (iVar1 != 0) {
          return 1;
        }
      }
      isUnix_local = 0;
    }
    else {
      isUnix_local = 1;
    }
  }
  return isUnix_local;
}

Assistant:

int cmOutputConverter::Shell__CharNeedsQuotes(char c, int isUnix, int flags)
{
  /* On Windows the built-in command shell echo never needs quotes.  */
  if(!isUnix && (flags & Shell_Flag_EchoWindows))
    {
    return 0;
    }

  /* On all platforms quotes are needed to preserve whitespace.  */
  if(Shell__CharIsWhitespace(c))
    {
    return 1;
    }

  if(isUnix)
    {
    /* On UNIX several special characters need quotes to preserve them.  */
    if(Shell__CharNeedsQuotesOnUnix(c))
      {
      return 1;
      }
    }
  else
    {
    /* On Windows several special characters need quotes to preserve them.  */
    if(Shell__CharNeedsQuotesOnWindows(c))
      {
      return 1;
      }
    }
  return 0;
}